

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  byte bVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  int iVar163;
  uint uVar164;
  uint uVar165;
  ulong uVar166;
  uint uVar167;
  int iVar168;
  uint extraout_EDX;
  ulong uVar169;
  ulong uVar170;
  secp256k1_ge *psVar171;
  uint uVar172;
  ulong unaff_RBP;
  ulong uVar173;
  secp256k1_ge_storage *a;
  long lVar174;
  secp256k1_ge *psVar175;
  secp256k1_scalar *scalar;
  secp256k1_scalar *wnaf;
  ulong uVar176;
  ulong uVar177;
  ulong uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  ulong uVar185;
  uint uVar186;
  ulong unaff_R12;
  ulong uVar187;
  uint uVar188;
  ulong unaff_R13;
  ulong uVar189;
  secp256k1_ge *unaff_R14;
  ulong uVar190;
  ulong unaff_R15;
  ulong uVar191;
  byte bVar192;
  uint64_t tmp1;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_ge p;
  secp256k1_gej g2;
  secp256k1_ge q;
  secp256k1_ge gg;
  secp256k1_scalar sStack_840;
  secp256k1_scalar sStack_820;
  ulong uStack_7f8;
  secp256k1_scalar sStack_7f0;
  ulong uStack_7d0;
  ulong uStack_7c8;
  ulong uStack_7c0;
  ulong uStack_7b8;
  secp256k1_scalar sStack_7b0;
  long lStack_790;
  long lStack_788;
  undefined1 auStack_780 [16];
  secp256k1_scalar asStack_770 [32];
  secp256k1_ge *psStack_368;
  ulong uStack_360;
  ulong uStack_358;
  secp256k1_ge *psStack_350;
  ulong uStack_348;
  code *pcStack_340;
  long local_330;
  secp256k1_ge local_328;
  uint64_t local_2d0;
  uint64_t local_2c8;
  uint64_t local_2c0;
  undefined1 local_2b8 [56];
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  secp256k1_ge *psStack_268;
  secp256k1_fe local_258;
  ulong local_228;
  secp256k1_ge_storage *local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  secp256k1_ge local_1e8;
  undefined1 local_190 [40];
  undefined1 local_168 [24];
  uint64_t uStack_150;
  undefined1 local_148 [16];
  undefined1 auStack_138 [16];
  undefined1 auStack_128 [16];
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t uStack_108;
  uint64_t uStack_100;
  uint64_t uStack_f8;
  int local_f0;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  bVar192 = 0;
  psVar171 = &local_1e8;
  pcStack_340 = (code *)0x161d2c;
  local_220 = pre_g;
  secp256k1_ge_from_storage(psVar171,pre_g);
  iVar168 = (int)pre_g;
  pcStack_340 = (code *)0x161d34;
  psVar175 = psVar171;
  iVar163 = secp256k1_ge_is_valid_var(psVar171);
  if (iVar163 != 0) {
    local_f0 = local_1e8.infinity;
    local_168._8_8_ = local_1e8.x.n[1];
    local_168._0_8_ = local_1e8.x.n[0];
    uStack_150 = local_1e8.x.n[3];
    local_168._16_8_ = local_1e8.x.n[2];
    local_148._8_8_ = local_1e8.y.n[0];
    local_148._0_8_ = local_1e8.x.n[4];
    auStack_138._8_8_ = local_1e8.y.n[2];
    auStack_138._0_8_ = local_1e8.y.n[1];
    auStack_128._8_8_ = local_1e8.y.n[4];
    auStack_128._0_8_ = local_1e8.y.n[3];
    local_118 = 1;
    uStack_110 = 0;
    uStack_108 = 0;
    uStack_100 = 0;
    uStack_f8 = 0;
    if (local_1e8.infinity == 0) {
      pcStack_340 = (code *)0x161e3c;
      secp256k1_gej_double((secp256k1_gej *)local_168,(secp256k1_gej *)local_168);
    }
    else {
      local_f0 = 1;
      local_168._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffea8 = (undefined1  [16])0x0;
      local_148 = (undefined1  [16])0x0;
      auStack_138 = (undefined1  [16])0x0;
      auStack_128 = (undefined1  [16])0x0;
      local_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
    }
    pcStack_340 = (code *)0x161e7c;
    secp256k1_ge_set_gej_var(&local_88,(secp256k1_gej *)local_168);
    local_2c0 = local_88.x.n[1];
    local_2c8 = local_88.x.n[2];
    local_2d0 = local_88.x.n[3];
    local_328._80_8_ = local_88.x.n[4];
    local_328.y.n[4] = local_88.y.n[0];
    local_328.y.n[3] = local_88.y.n[1];
    local_328.y.n[2] = local_88.y.n[2];
    local_328.y.n[1] = local_88.y.n[3];
    local_330 = 0x40;
    local_328.y.n[0] = local_88.y.n[4];
    local_228 = local_88.x.n[0];
    while( true ) {
      unaff_RBP = local_228;
      unaff_R14 = (secp256k1_ge *)0x3ffffbfffff0bc;
      unaff_R13 = 0x1000003d1;
      unaff_R12 = 0xffffffffffff;
      psVar171 = (secp256k1_ge *)0x3ffffffffffffc;
      uVar166 = (local_328._80_8_ - local_1e8.x.n[4]) + 0x3fffffffffffc;
      local_258.n[0] =
           (uVar166 >> 0x30) * 0x1000003d1 + (local_228 - local_1e8.x.n[0]) + 0x3ffffbfffff0bc;
      local_258.n[1] = (local_258.n[0] >> 0x34) + (local_2c0 - local_1e8.x.n[1]) + 0x3ffffffffffffc;
      local_258.n[0] = local_258.n[0] & 0xfffffffffffff;
      local_258.n[2] = (local_258.n[1] >> 0x34) + (local_2c8 - local_1e8.x.n[2]) + 0x3ffffffffffffc;
      local_258.n[1] = local_258.n[1] & 0xfffffffffffff;
      local_258.n[3] = (local_258.n[2] >> 0x34) + (local_2d0 - local_1e8.x.n[3]) + 0x3ffffffffffffc;
      local_258.n[2] = local_258.n[2] & 0xfffffffffffff;
      local_258.n[4] = (local_258.n[3] >> 0x34) + (uVar166 & 0xffffffffffff);
      local_258.n[3] = local_258.n[3] & 0xfffffffffffff;
      uVar166 = (local_328.y.n[0] - local_1e8.y.n[4]) + 0x3fffffffffffc;
      local_2b8._48_8_ =
           (uVar166 >> 0x30) * 0x1000003d1 +
           (local_328.y.n[4] - local_1e8.y.n[0]) + 0x3ffffbfffff0bc;
      uVar173 = ((ulong)local_2b8._48_8_ >> 0x34) +
                (local_328.y.n[3] - local_1e8.y.n[1]) + 0x3ffffffffffffc;
      local_278 = (uVar173 >> 0x34) + (local_328.y.n[2] - local_1e8.y.n[2]) + 0x3ffffffffffffc;
      uStack_270 = (local_278 >> 0x34) + (local_328.y.n[1] - local_1e8.y.n[3]) + 0x3ffffffffffffc;
      psStack_268 = (secp256k1_ge *)((uStack_270 >> 0x34) + (uVar166 & 0xffffffffffff));
      local_2b8._48_8_ = local_2b8._48_8_ & 0xfffffffffffff;
      uVar173 = uVar173 & 0xfffffffffffff;
      local_278 = local_278 & 0xfffffffffffff;
      uStack_270 = uStack_270 & 0xfffffffffffff;
      pcStack_340 = (code *)0x16207b;
      uStack_280 = uVar173;
      iVar163 = secp256k1_fe_impl_normalizes_to_zero_var(&local_258);
      iVar168 = (int)uVar173;
      if (iVar163 != 0) break;
LAB_00162094:
      a = (secp256k1_ge_storage *)((long)(local_220->x).n + local_330);
      psVar171 = &local_e0;
      pcStack_340 = (code *)0x1620b5;
      secp256k1_ge_from_storage(psVar171,a);
      iVar168 = (int)a;
      pcStack_340 = (code *)0x1620bd;
      psVar175 = psVar171;
      iVar163 = secp256k1_ge_is_valid_var(psVar171);
      if (iVar163 == 0) {
        pcStack_340 = (code *)0x162ad0;
        test_pre_g_table_cold_5();
LAB_00162ad0:
        pcStack_340 = (code *)0x162ad5;
        test_pre_g_table_cold_4();
        goto LAB_00162ad5;
      }
      uVar166 = (local_328._80_8_ - local_e0.x.n[4]) + 0x3fffffffffffc;
      uVar173 = (uVar166 >> 0x30) * 0x1000003d1 + (unaff_RBP - local_e0.x.n[0]) + 0x3ffffbfffff0bc;
      uVar190 = (uVar173 >> 0x34) + (local_2c0 - local_e0.x.n[1]) + 0x3ffffffffffffc;
      uVar191 = (uVar190 >> 0x34) + (local_2c8 - local_e0.x.n[2]) + 0x3ffffffffffffc;
      local_200 = (uVar191 >> 0x34) + (local_2d0 - local_e0.x.n[3]) + 0x3ffffffffffffc;
      local_208 = (local_200 >> 0x34) + (uVar166 & 0xffffffffffff);
      lVar174 = local_e0.y.n[2] + local_328.y.n[2];
      uVar166 = (local_e0.y.n[4] + local_328.y.n[0] >> 0x30) * 0x1000003d1 +
                local_e0.y.n[0] + local_328.y.n[4];
      uVar187 = (uVar166 >> 0x34) + local_e0.y.n[1] + local_328.y.n[3];
      uVar189 = (uVar187 >> 0x34) + lVar174;
      local_2b8._24_8_ = (uVar189 >> 0x34) + local_e0.y.n[3] + local_328.y.n[1];
      local_2b8._32_8_ =
           ((ulong)local_2b8._24_8_ >> 0x34) + (local_e0.y.n[4] + local_328.y.n[0] & 0xffffffffffff)
      ;
      psVar171 = (secp256k1_ge *)(uVar173 & 0xfffffffffffff);
      unaff_R14 = (secp256k1_ge *)(uVar190 & 0xfffffffffffff);
      unaff_R15 = uVar191 & 0xfffffffffffff;
      local_200 = local_200 & 0xfffffffffffff;
      unaff_RBP = uVar166 & 0xfffffffffffff;
      unaff_R12 = uVar187 & 0xfffffffffffff;
      unaff_R13 = uVar189 & 0xfffffffffffff;
      local_2b8._24_8_ = local_2b8._24_8_ & 0xfffffffffffff;
      pcStack_340 = (code *)0x162292;
      local_2b8._0_8_ = unaff_RBP;
      local_2b8._8_8_ = unaff_R12;
      local_2b8._16_8_ = unaff_R13;
      local_218 = local_2b8._32_8_;
      local_210 = local_2b8._24_8_;
      local_190._0_8_ = psVar171;
      local_190._8_8_ = unaff_R14;
      local_190._16_8_ = unaff_R15;
      local_190._24_8_ = local_200;
      local_190._32_8_ = local_208;
      iVar163 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)local_190);
      iVar168 = (int)lVar174;
      if (iVar163 != 0) {
        psVar175 = (secp256k1_ge *)local_2b8;
        pcStack_340 = (code *)0x1622a3;
        iVar163 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar175);
        if (iVar163 == 0) goto LAB_001622ab;
        goto LAB_00162ada;
      }
LAB_001622ab:
      local_328.x.n[0] = (long)psVar171 + (0x3ffffbfffff0bc - local_258.n[0]);
      psVar171 = (secp256k1_ge *)0x3ffffffffffffc;
      local_328.x.n[1] = (long)unaff_R14 + (0x3ffffffffffffc - local_258.n[1]);
      unaff_R15 = (unaff_R15 + 0x3ffffffffffffc) - local_258.n[2];
      local_328.x.n[3] = (local_200 - local_258.n[3]) + 0x3ffffffffffffc;
      local_328.x.n[4] = (local_208 - local_258.n[4]) + 0x3fffffffffffc;
      unaff_R14 = &local_328;
      pcStack_340 = (code *)0x162331;
      local_328.x.n[2] = unaff_R15;
      iVar163 = secp256k1_fe_impl_normalizes_to_zero_var(&unaff_R14->x);
      if (iVar163 != 0) {
        unaff_RBP = (unaff_RBP + 0x3ffffbfffff0bc) - local_2b8._48_8_;
        unaff_R12 = (unaff_R12 + 0x3ffffffffffffc) - uStack_280;
        unaff_R13 = (unaff_R13 + 0x3ffffffffffffc) - local_278;
        local_328.x.n[3] = (local_210 - uStack_270) + 0x3ffffffffffffc;
        local_328.x.n[4] = (local_218 - (long)psStack_268) + 0x3fffffffffffc;
        pcStack_340 = (code *)0x1623a8;
        psVar175 = unaff_R14;
        local_328.x.n[0] = unaff_RBP;
        local_328.x.n[1] = unaff_R12;
        local_328.x.n[2] = unaff_R13;
        iVar163 = secp256k1_fe_impl_normalizes_to_zero_var(&unaff_R14->x);
        if (iVar163 == 0) goto LAB_001623b0;
        goto LAB_00162adf;
      }
LAB_001623b0:
      unaff_R14 = psStack_268;
      unaff_R13 = uStack_270;
      unaff_R12 = local_278;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_2b8._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_258.n[3];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_2b8._8_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_258.n[2];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_2b8._16_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_258.n[1];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_2b8._24_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_258.n[0];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_2b8._32_8_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_258.n[4];
      uVar166 = SUB168(auVar7 * auVar83,0);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar166 & 0xfffffffffffff;
      auVar3 = auVar4 * auVar80 + auVar3 * auVar79 + auVar5 * auVar81 + auVar6 * auVar82 +
               auVar8 * ZEXT816(0x1000003d10);
      uVar187 = auVar3._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar187 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_2b8._0_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_258.n[4];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_2b8._8_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_258.n[3];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_2b8._16_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_258.n[2];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_2b8._24_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = local_258.n[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_2b8._32_8_;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_258.n[0];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar166 >> 0x34 | SUB168(auVar7 * auVar83,8) << 0xc;
      auVar3 = auVar9 * auVar84 + auVar148 + auVar10 * auVar85 + auVar11 * auVar86 +
               auVar12 * auVar87 + auVar13 * auVar88 + auVar14 * ZEXT816(0x1000003d10);
      uVar189 = auVar3._0_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar189 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_2b8._0_8_;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_258.n[0];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_2b8._8_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_258.n[4];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_2b8._16_8_;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_258.n[3];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_2b8._24_8_;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_258.n[2];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_2b8._32_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_258.n[1];
      auVar3 = auVar16 * auVar90 + auVar149 + auVar17 * auVar91 + auVar18 * auVar92 +
               auVar19 * auVar93;
      uVar166 = auVar3._0_8_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar166 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = (uVar166 & 0xfffffffffffff) << 4 | (uVar189 & 0xfffffffffffff) >> 0x30;
      auVar3 = auVar15 * auVar89 + ZEXT816(0x1000003d1) * auVar94;
      uVar173 = auVar3._0_8_;
      uVar166 = uVar173 & 0xfffffffffffff;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar173 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_2b8._0_8_;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_258.n[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_2b8._8_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = local_258.n[0];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_2b8._16_8_;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_258.n[4];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_2b8._24_8_;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_258.n[3];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_2b8._32_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_258.n[2];
      auVar4 = auVar22 * auVar97 + auVar151 + auVar23 * auVar98 + auVar24 * auVar99;
      uVar173 = auVar4._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar173 & 0xfffffffffffff;
      auVar3 = auVar20 * auVar95 + auVar150 + auVar21 * auVar96 + auVar25 * ZEXT816(0x1000003d10);
      uVar190 = auVar3._0_8_;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar173 >> 0x34 | auVar4._8_8_ << 0xc;
      uVar173 = uVar190 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar190 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_2b8._0_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = local_258.n[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_2b8._8_8_;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = local_258.n[1];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_2b8._16_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_258.n[0];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_2b8._24_8_;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_258.n[4];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_2b8._32_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_258.n[3];
      auVar4 = auVar29 * auVar103 + auVar153 + auVar30 * auVar104;
      uVar190 = auVar4._0_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar190 & 0xfffffffffffff;
      auVar3 = auVar26 * auVar100 + auVar152 + auVar27 * auVar101 + auVar28 * auVar102 +
               auVar31 * ZEXT816(0x1000003d10);
      uVar191 = auVar3._0_8_;
      local_258.n[2] = uVar191 & 0xfffffffffffff;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = (uVar191 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar187 & 0xfffffffffffff);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar190 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar154 = auVar32 * ZEXT816(0x1000003d10) + auVar154;
      uVar187 = auVar154._0_8_;
      local_258.n[3] = uVar187 & 0xfffffffffffff;
      local_258.n[4] = (uVar187 >> 0x34 | auVar154._8_8_ << 0xc) + (uVar189 & 0xffffffffffff);
      psVar171 = (secp256k1_ge *)local_190;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_190._0_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uStack_270;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_190._8_8_;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = local_278;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_190._16_8_;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uStack_280;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_190._24_8_;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_2b8._48_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_190._32_8_;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = psStack_268;
      uVar187 = SUB168(auVar37 * auVar109,0);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar187 & 0xfffffffffffff;
      auVar3 = auVar34 * auVar106 + auVar33 * auVar105 + auVar35 * auVar107 + auVar36 * auVar108 +
               auVar38 * ZEXT816(0x1000003d10);
      uVar190 = auVar3._0_8_;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = uVar190 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_190._0_8_;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = psStack_268;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_190._8_8_;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uStack_270;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_190._16_8_;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = local_278;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_190._24_8_;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uStack_280;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_190._32_8_;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_2b8._48_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar187 >> 0x34 | SUB168(auVar37 * auVar109,8) << 0xc;
      auVar3 = auVar39 * auVar110 + auVar155 + auVar40 * auVar111 + auVar41 * auVar112 +
               auVar42 * auVar113 + auVar43 * auVar114 + auVar44 * ZEXT816(0x1000003d10);
      uVar191 = auVar3._0_8_;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = uVar191 >> 0x34 | auVar3._8_8_ << 0xc;
      local_1f8 = (uVar191 & 0xfffffffffffff) >> 0x30;
      uVar191 = uVar191 & 0xffffffffffff;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_190._0_8_;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_2b8._48_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_190._8_8_;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = psStack_268;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_190._16_8_;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uStack_270;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_190._24_8_;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_278;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_190._32_8_;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uStack_280;
      auVar3 = auVar46 * auVar116 + auVar156 + auVar47 * auVar117 + auVar48 * auVar118 +
               auVar49 * auVar119;
      uVar187 = auVar3._0_8_;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = uVar187 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = (uVar187 & 0xfffffffffffff) << 4 | local_1f8;
      auVar3 = auVar45 * auVar115 + ZEXT816(0x1000003d1) * auVar120;
      uVar189 = auVar3._0_8_;
      uVar187 = uVar189 & 0xfffffffffffff;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = uVar189 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_190._0_8_;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uStack_280;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_190._8_8_;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_2b8._48_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_190._16_8_;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = psStack_268;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_190._24_8_;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uStack_270;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_190._32_8_;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_278;
      auVar4 = auVar52 * auVar123 + auVar158 + auVar53 * auVar124 + auVar54 * auVar125;
      uVar189 = auVar4._0_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar189 & 0xfffffffffffff;
      auVar3 = auVar50 * auVar121 + auVar157 + auVar51 * auVar122 + auVar55 * ZEXT816(0x1000003d10);
      uVar176 = auVar3._0_8_;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = uVar189 >> 0x34 | auVar4._8_8_ << 0xc;
      uVar189 = uVar176 & 0xfffffffffffff;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = uVar176 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_190._0_8_;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_278;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_190._8_8_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uStack_280;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_190._16_8_;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_2b8._48_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_190._24_8_;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = psStack_268;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_190._32_8_;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uStack_270;
      auVar4 = auVar59 * auVar129 + auVar160 + auVar60 * auVar130;
      uVar176 = auVar4._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar176 & 0xfffffffffffff;
      auVar3 = auVar56 * auVar126 + auVar159 + auVar57 * auVar127 + auVar58 * auVar128 +
               auVar61 * ZEXT816(0x1000003d10);
      uVar177 = auVar3._0_8_;
      local_278 = uVar177 & 0xfffffffffffff;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = (uVar177 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar190 & 0xfffffffffffff);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar176 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar161 = auVar62 * ZEXT816(0x1000003d10) + auVar161;
      uVar190 = auVar161._0_8_;
      uStack_270 = uVar190 & 0xfffffffffffff;
      psStack_268 = (secp256k1_ge *)((uVar190 >> 0x34 | auVar161._8_8_ << 0xc) + uVar191);
      local_328.x.n[0] = (uVar187 - uVar166) + 0x3ffffbfffff0bc;
      local_328.x.n[1] = (uVar189 - uVar173) + 0x3ffffffffffffc;
      local_328.x.n[2] = (local_278 - local_258.n[2]) + 0x3ffffffffffffc;
      local_328.x.n[3] = (uStack_270 - local_258.n[3]) + 0x3ffffffffffffc;
      local_328.x.n[4] = (long)psStack_268 + (0x3fffffffffffc - local_258.n[4]);
      psVar175 = &local_328;
      pcStack_340 = (code *)0x162a5c;
      local_2b8._48_8_ = uVar187;
      uStack_280 = uVar189;
      local_258.n[0] = uVar166;
      local_258.n[1] = uVar173;
      local_1f0 = uVar191;
      iVar163 = secp256k1_fe_impl_normalizes_to_zero_var(&psVar175->x);
      iVar168 = (int)uVar191;
      if (iVar163 == 0) goto LAB_00162ad0;
      psVar175 = &local_e0;
      psVar171 = &local_1e8;
      for (lVar174 = 0xb; lVar174 != 0; lVar174 = lVar174 + -1) {
        (psVar171->x).n[0] = (psVar175->x).n[0];
        psVar175 = (secp256k1_ge *)((long)psVar175 + ((ulong)bVar192 * -2 + 1) * 8);
        psVar171 = (secp256k1_ge *)((long)psVar171 + ((ulong)bVar192 * -2 + 1) * 8);
      }
      local_330 = local_330 + 0x40;
      if (local_330 == 0x80000) {
        return;
      }
    }
    psVar175 = (secp256k1_ge *)(local_2b8 + 0x30);
    pcStack_340 = (code *)0x16208c;
    iVar163 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar175);
    if (iVar163 == 0) goto LAB_00162094;
LAB_00162ad5:
    unaff_R15 = 0x3fffffffffffc;
    pcStack_340 = (code *)0x162ada;
    test_pre_g_table_cold_1();
LAB_00162ada:
    pcStack_340 = (code *)0x162adf;
    test_pre_g_table_cold_2();
LAB_00162adf:
    pcStack_340 = (code *)0x162ae4;
    test_pre_g_table_cold_3();
  }
  pcStack_340 = test_constant_wnaf;
  test_pre_g_table_cold_6();
  psStack_368 = psVar171;
  uStack_360 = unaff_R12;
  uStack_358 = unaff_R13;
  psStack_350 = unaff_R14;
  uStack_348 = unaff_R15;
  pcStack_340 = (code *)unaff_RBP;
  memset(asStack_770,0,0x400);
  sStack_840.d[0] = (psVar175->x).n[0];
  sStack_840.d[2] = (psVar175->x).n[2];
  sStack_840.d[3] = (psVar175->x).n[3];
  uVar164 = 1 << ((byte)iVar168 & 0x1f);
  uStack_7d0 = (ulong)uVar164;
  sStack_820.d[0] = 0;
  sStack_820.d[1] = 0;
  sStack_820.d[2] = 0;
  sStack_820.d[3] = 0;
  uStack_7c8 = 0;
  uStack_7c0 = 0;
  uStack_7b8 = 0;
  iVar163 = 0x10;
  sStack_840.d[1] = (psVar175->x).n[1];
  do {
    uVar166 = sStack_840.d[1];
    sStack_840.d[0] = sStack_840.d[0] >> 8 | uVar166 << 0x38;
    sStack_840.d[1] = uVar166 >> 8 | sStack_840.d[2] << 0x38;
    sStack_840.d[2] = sStack_840.d[2] >> 8 | sStack_840.d[3] << 0x38;
    sStack_840.d[3] = sStack_840.d[3] >> 8;
    iVar163 = iVar163 + -1;
  } while (iVar163 != 0);
  scalar = &sStack_840;
  wnaf = asStack_770;
  uVar165 = secp256k1_wnaf_const((int *)wnaf,scalar,iVar168,(int)(uVar166 >> 8));
  uVar166 = (long)(iVar168 + 0x7f) / (long)iVar168;
  if ((int)uVar166 < 0) {
    uVar173 = 0;
    uVar187 = 0;
    uVar189 = 0;
    uVar190 = 0;
  }
  else {
    uVar166 = uVar166 & 0xffffffff;
    do {
      uVar186 = *(uint *)((long)asStack_770[0].d + uVar166 * 4);
      if ((ulong)uVar186 == 0) {
        test_constant_wnaf_cold_5();
LAB_00162e5d:
        test_constant_wnaf_cold_4();
LAB_00162e62:
        test_constant_wnaf_cold_1();
LAB_00162e67:
        test_constant_wnaf_cold_2();
        goto LAB_00162e6c;
      }
      if ((uVar186 & 1) == 0) goto LAB_00162e5d;
      if ((int)uVar186 <= (int)-uVar164) goto LAB_00162e62;
      if ((int)uVar164 <= (int)uVar186) goto LAB_00162e67;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = sStack_820.d[0];
      auVar131._8_8_ = 0;
      auVar131._0_8_ = uStack_7d0;
      uVar189 = SUB168(auVar63 * auVar131,8);
      auVar162._8_8_ = 0;
      auVar162._0_8_ = uVar189;
      sStack_7b0.d[0] = SUB168(auVar63 * auVar131,0);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = sStack_820.d[0];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uStack_7c8;
      auVar64 = auVar64 * auVar132;
      uVar187 = SUB168(auVar64 + auVar162,0);
      uVar191 = SUB168(auVar64 + auVar162,8);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = sStack_820.d[1];
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uStack_7d0;
      uVar190 = SUB168(auVar65 * auVar133,8);
      uVar173 = SUB168(auVar65 * auVar133,0);
      sStack_7b0.d[1] = uVar187 + uVar173;
      uVar173 = (ulong)CARRY8(uVar187,uVar173);
      uVar187 = uVar191 + uVar190;
      uVar176 = uVar187 + uVar173;
      uVar182 = (ulong)CARRY8(auVar64._8_8_,(ulong)CARRY8(uVar189,auVar64._0_8_)) +
                (ulong)(CARRY8(uVar191,uVar190) || CARRY8(uVar187,uVar173));
      auVar66._8_8_ = 0;
      auVar66._0_8_ = sStack_820.d[0];
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uStack_7c0;
      uVar177 = SUB168(auVar66 * auVar134,8);
      uVar173 = SUB168(auVar66 * auVar134,0);
      uVar189 = uVar176 + uVar173;
      uVar173 = (ulong)CARRY8(uVar176,uVar173);
      uVar190 = uVar182 + uVar177;
      uVar183 = uVar190 + uVar173;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = sStack_820.d[1];
      auVar135._8_8_ = 0;
      auVar135._0_8_ = uStack_7c8;
      uVar169 = SUB168(auVar67 * auVar135,8);
      uVar187 = SUB168(auVar67 * auVar135,0);
      uVar176 = uVar189 + uVar187;
      uVar187 = (ulong)CARRY8(uVar189,uVar187);
      uVar191 = uVar183 + uVar169;
      uVar184 = uVar191 + uVar187;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = sStack_820.d[2];
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uStack_7d0;
      uVar170 = SUB168(auVar68 * auVar136,8);
      uVar189 = SUB168(auVar68 * auVar136,0);
      sStack_7b0.d[2] = uVar176 + uVar189;
      uVar189 = (ulong)CARRY8(uVar176,uVar189);
      uVar176 = uVar184 + uVar170;
      uVar185 = uVar176 + uVar189;
      uVar178 = (ulong)(CARRY8(uVar182,uVar177) || CARRY8(uVar190,uVar173)) +
                (ulong)(CARRY8(uVar183,uVar169) || CARRY8(uVar191,uVar187)) +
                (ulong)(CARRY8(uVar184,uVar170) || CARRY8(uVar176,uVar189));
      auVar69._8_8_ = 0;
      auVar69._0_8_ = sStack_820.d[0];
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uStack_7b8;
      uVar170 = SUB168(auVar69 * auVar137,8);
      uVar173 = SUB168(auVar69 * auVar137,0);
      uVar189 = uVar185 + uVar173;
      uVar173 = (ulong)CARRY8(uVar185,uVar173);
      uVar191 = uVar178 + uVar170;
      uVar185 = uVar191 + uVar173;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = sStack_820.d[1];
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uStack_7c0;
      uVar182 = SUB168(auVar70 * auVar138,8);
      uVar187 = SUB168(auVar70 * auVar138,0);
      uVar190 = uVar189 + uVar187;
      uVar187 = (ulong)CARRY8(uVar189,uVar187);
      uVar176 = uVar185 + uVar182;
      uVar179 = uVar176 + uVar187;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = sStack_820.d[2];
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uStack_7c8;
      uVar183 = SUB168(auVar71 * auVar139,8);
      uVar189 = SUB168(auVar71 * auVar139,0);
      uVar169 = uVar190 + uVar189;
      uVar189 = (ulong)CARRY8(uVar190,uVar189);
      uVar177 = uVar179 + uVar183;
      uVar180 = uVar177 + uVar189;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = sStack_820.d[3];
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uStack_7d0;
      uVar184 = SUB168(auVar72 * auVar140,8);
      uVar190 = SUB168(auVar72 * auVar140,0);
      sStack_7b0.d[3] = uVar169 + uVar190;
      uVar190 = (ulong)CARRY8(uVar169,uVar190);
      uVar169 = uVar180 + uVar184;
      uVar181 = uVar169 + uVar190;
      uVar182 = (ulong)(CARRY8(uVar178,uVar170) || CARRY8(uVar191,uVar173)) +
                (ulong)(CARRY8(uVar185,uVar182) || CARRY8(uVar176,uVar187)) +
                (ulong)(CARRY8(uVar179,uVar183) || CARRY8(uVar177,uVar189)) +
                (ulong)(CARRY8(uVar180,uVar184) || CARRY8(uVar169,uVar190));
      auVar73._8_8_ = 0;
      auVar73._0_8_ = sStack_820.d[1];
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uStack_7b8;
      uVar177 = SUB168(auVar73 * auVar141,8);
      uVar173 = SUB168(auVar73 * auVar141,0);
      uVar189 = uVar181 + uVar173;
      uVar173 = (ulong)CARRY8(uVar181,uVar173);
      uVar190 = uVar182 + uVar177;
      uVar183 = uVar190 + uVar173;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = sStack_820.d[2];
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uStack_7c0;
      uVar169 = SUB168(auVar74 * auVar142,8);
      uVar187 = SUB168(auVar74 * auVar142,0);
      uVar176 = uVar189 + uVar187;
      uVar187 = (ulong)CARRY8(uVar189,uVar187);
      uVar191 = uVar183 + uVar169;
      uVar184 = uVar191 + uVar187;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = sStack_820.d[3];
      auVar143._8_8_ = 0;
      auVar143._0_8_ = uStack_7c8;
      uVar170 = SUB168(auVar75 * auVar143,8);
      uVar189 = SUB168(auVar75 * auVar143,0);
      lStack_790 = uVar176 + uVar189;
      uVar189 = (ulong)CARRY8(uVar176,uVar189);
      uVar176 = uVar184 + uVar170;
      uVar178 = uVar176 + uVar189;
      uVar177 = (ulong)(CARRY8(uVar182,uVar177) || CARRY8(uVar190,uVar173)) +
                (ulong)(CARRY8(uVar183,uVar169) || CARRY8(uVar191,uVar187)) +
                (ulong)(CARRY8(uVar184,uVar170) || CARRY8(uVar176,uVar189));
      auVar76._8_8_ = 0;
      auVar76._0_8_ = sStack_820.d[2];
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uStack_7b8;
      uVar191 = SUB168(auVar76 * auVar144,8);
      uVar173 = SUB168(auVar76 * auVar144,0);
      uVar190 = uVar178 + uVar173;
      uVar173 = (ulong)CARRY8(uVar178,uVar173);
      uVar189 = uVar177 + uVar191;
      uVar169 = uVar189 + uVar173;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = sStack_820.d[3];
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uStack_7c0;
      uVar176 = SUB168(auVar77 * auVar145,8);
      uVar187 = SUB168(auVar77 * auVar145,0);
      lStack_788 = uVar190 + uVar187;
      uVar187 = (ulong)CARRY8(uVar190,uVar187);
      uVar190 = uVar169 + uVar176;
      auStack_780._8_8_ =
           (ulong)(CARRY8(uVar177,uVar191) || CARRY8(uVar189,uVar173)) +
           (ulong)(CARRY8(uVar169,uVar176) || CARRY8(uVar190,uVar187));
      auStack_780._0_8_ = uVar190 + uVar187;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = sStack_820.d[3];
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uStack_7b8;
      auStack_780 = auVar78 * auVar146 + auStack_780;
      scalar = &sStack_820;
      uStack_7f8 = uVar166;
      secp256k1_scalar_reduce_512(scalar,sStack_7b0.d);
      if ((int)uVar186 < 0) {
        sStack_7f0.d[0] = (uint64_t)-uVar186;
        sStack_7f0.d[1] = 0;
        sStack_7f0.d[2] = 0;
        sStack_7f0.d[3] = 0;
        secp256k1_scalar_negate(&sStack_7f0,&sStack_7f0);
      }
      else {
        sStack_7f0.d[1] = 0;
        sStack_7f0.d[2] = 0;
        sStack_7f0.d[3] = 0;
        sStack_7f0.d[0] = (ulong)uVar186;
      }
      wnaf = scalar;
      secp256k1_scalar_add(scalar,scalar,&sStack_7f0);
      uVar166 = (ulong)((int)uStack_7f8 - 1);
      uVar173 = sStack_820.d[1];
      uVar187 = sStack_820.d[0];
      uVar189 = sStack_820.d[3];
      uVar190 = sStack_820.d[2];
    } while (0 < (int)uStack_7f8);
  }
  sStack_7b0.d[0] = (uint64_t)uVar165;
  sStack_7b0.d[1] = 0;
  sStack_7b0.d[2] = 0;
  sStack_7b0.d[3] = 0;
  scalar = &sStack_840;
  wnaf = scalar;
  secp256k1_scalar_add(scalar,scalar,&sStack_7b0);
  if ((((uVar187 == sStack_840.d[0]) && (uVar173 == sStack_840.d[1])) &&
      (uVar190 == sStack_840.d[2])) && (uVar189 == sStack_840.d[3])) {
    return;
  }
LAB_00162e6c:
  test_constant_wnaf_cold_3();
  if (((scalar->d[1] == 0 && scalar->d[2] == 0) && scalar->d[3] == 0) && scalar->d[0] == 0) {
    uVar166 = (long)(int)(extraout_EDX + 0x7f) / (long)(int)extraout_EDX;
    if ((int)uVar166 < 1) {
      return;
    }
    memset(wnaf,0,(uVar166 & 0xffffffff) << 2);
    return;
  }
  uVar164 = (uint)scalar->d[0];
  bVar192 = (byte)extraout_EDX;
  *(uint *)wnaf->d = (~(uint)(-1L << (bVar192 & 0x3f)) & uVar164) + (~uVar164 & 1);
  uVar166 = (long)(int)(extraout_EDX + 0x7f) / (long)(int)extraout_EDX;
  uVar173 = uVar166 & 0xffffffff;
  iVar163 = (int)uVar166;
  if (iVar163 < 2) {
    return;
  }
  uVar164 = iVar163 - 1;
  uVar165 = uVar164 * extraout_EDX;
  uVar186 = 0x80 - uVar165;
  lVar174 = 0;
  uVar166 = (ulong)uVar164;
  while( true ) {
    uVar188 = extraout_EDX;
    if (lVar174 == 0) {
      uVar188 = uVar186;
    }
    uVar167 = (uVar188 + uVar165) - 1 >> 6;
    uVar172 = uVar165 >> 6;
    if (uVar167 == uVar172) {
      uVar167 = (uint)(scalar->d[uVar167] >> ((byte)uVar165 & 0x3f));
    }
    else {
      bVar147 = (byte)uVar165 & 0x3f;
      uVar167 = (uint)(scalar->d[uVar172] >> bVar147) |
                (uint)(scalar->d[(ulong)uVar172 + 1] << 0x40 - bVar147);
    }
    if ((~(uint)(-1L << ((byte)uVar188 & 0x3f)) & uVar167) != 0) break;
    *(undefined4 *)((long)wnaf->d + uVar166 * 4) = 0;
    uVar173 = (ulong)((int)uVar173 - 1);
    uVar165 = uVar165 - extraout_EDX;
    lVar174 = lVar174 + 1;
    bVar2 = (long)uVar166 < 2;
    uVar166 = uVar166 - 1;
    if (bVar2) {
      return;
    }
  }
  if ((long)uVar166 < 1) {
    return;
  }
  iVar163 = -1 << (bVar192 & 0x1f);
  uVar166 = 1;
  uVar165 = extraout_EDX;
  do {
    uVar188 = extraout_EDX;
    if (uVar164 == uVar166) {
      uVar188 = uVar186;
    }
    uVar172 = (uVar188 + uVar165) - 1 >> 6;
    uVar167 = uVar165 >> 6;
    if (uVar172 == uVar167) {
      uVar187 = scalar->d[uVar172] >> ((byte)uVar165 & 0x3f);
    }
    else {
      bVar147 = (byte)uVar165 & 0x3f;
      uVar187 = scalar->d[uVar167] >> bVar147 | scalar->d[(ulong)uVar167 + 1] << 0x40 - bVar147;
    }
    uVar187 = ~(-1L << ((byte)uVar188 & 0x3f)) & uVar187;
    uVar188 = (uint)uVar187;
    if ((uVar187 & 1) == 0) {
      piVar1 = (int *)((long)wnaf->d + uVar166 * 4 + -4);
      *piVar1 = *piVar1 + iVar163;
      uVar188 = uVar188 | 1;
    }
    *(uint *)((long)wnaf->d + uVar166 * 4) = uVar188;
    if (1 < uVar166) {
      iVar168 = *(int *)((long)wnaf->d + uVar166 * 4 + -4);
      if (iVar168 == -1) {
        iVar168 = *(int *)((long)wnaf->d + uVar166 * 4 + -8);
        if (0 < iVar168) {
          iVar168 = iVar168 + iVar163;
          goto LAB_0016302b;
        }
      }
      else if ((iVar168 == 1) && (iVar168 = *(int *)((long)wnaf->d + uVar166 * 4 + -8), iVar168 < 0)
              ) {
        iVar168 = iVar168 + (1 << (bVar192 & 0x1f));
LAB_0016302b:
        *(int *)((long)wnaf->d + uVar166 * 4 + -8) = iVar168;
        *(undefined4 *)((long)wnaf->d + uVar166 * 4 + -4) = 0;
      }
    }
    uVar166 = uVar166 + 1;
    uVar165 = uVar165 + extraout_EDX;
    if (uVar173 == uVar166) {
      return;
    }
  } while( true );
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x); secp256k1_fe_normalize_weak(&dqx);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y); secp256k1_fe_normalize_weak(&dqy);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal_var(&dpx, &dqx) || !secp256k1_fe_equal_var(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal_var(&dpx, &dpy));

        p = q;
    }
}